

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<kj::Array<unsigned_char>_> __thiscall
kj::AsyncInputStream::readAllBytes(AsyncInputStream *this,uint64_t limit)

{
  PromiseArena *pPVar1;
  OwnPromiseNode node;
  Disposer *pDVar2;
  AllReader *limit_00;
  void *pvVar3;
  PromiseArena *in_RDX;
  TransformPromiseNodeBase *this_00;
  AllReader *ptrCopy;
  Promise<kj::Array<unsigned_char>_> promise;
  OwnPromiseNode local_48;
  Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t> local_40;
  
  limit_00 = (AllReader *)operator_new(0x28);
  limit_00->input = (AsyncInputStream *)limit;
  (limit_00->parts).builder.ptr = (Array<unsigned_char> *)0x0;
  (limit_00->parts).builder.pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
  (limit_00->parts).builder.endPtr = (Array<unsigned_char> *)0x0;
  (limit_00->parts).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  anon_unknown_123::AllReader::loop((AllReader *)&local_40,(uint64_t)limit_00);
  pDVar2 = local_40.disposer;
  pPVar1 = *(PromiseArena **)((long)local_40.disposer + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_40.disposer - (long)pPVar1) < 0x30) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_40,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:161:29)>
               ::anon_class_16_2_f81c8ca8_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d0) = &PTR_destroy_00621758;
    *(AllReader **)((long)pvVar3 + 0x3f0) = limit_00;
    *(PromiseArena **)((long)pvVar3 + 0x3f8) = in_RDX;
    *(void **)((long)pvVar3 + 0x3d8) = pvVar3;
  }
  else {
    *(PromiseArena **)((long)local_40.disposer + 8) = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)((long)local_40.disposer + -0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_40,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:161:29)>
               ::anon_class_16_2_f81c8ca8_for_func::operator());
    ((PromiseArenaMember *)((long)pDVar2 + -0x30))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_00621758;
    ((PromiseArenaMember *)((long)pDVar2 + -0x10))->_vptr_PromiseArenaMember =
         (_func_int **)limit_00;
    ((PromiseArenaMember *)((long)pDVar2 + -0x10))->arena = in_RDX;
    ((PromiseArenaMember *)((long)pDVar2 + -0x30))->arena = pPVar1;
  }
  pDVar2 = local_40.disposer;
  local_48.ptr = &this_00->super_PromiseNode;
  if ((PromiseArenaMember *)local_40.disposer != (PromiseArenaMember *)0x0) {
    local_40.disposer = (Disposer *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pDVar2);
  }
  local_40.disposer =
       (Disposer *)&kj::_::HeapDisposer<kj::(anonymous_namespace)::AllReader>::instance;
  local_40.ptr = limit_00;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader,decltype(nullptr)>>,kj::_::PromiseDisposer,kj::Own<kj::(anonymous_namespace)::AllReader,decltype(nullptr)>>
            ((PromiseDisposer *)this,&local_48,&local_40);
  if (local_40.ptr != (AllReader *)0x0) {
    (**(local_40.disposer)->_vptr_Disposer)();
  }
  node.ptr = local_48.ptr;
  if ((TransformPromiseNodeBase *)local_48.ptr != (TransformPromiseNodeBase *)0x0) {
    local_48.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<Array<byte>> AsyncInputStream::readAllBytes(uint64_t limit) {
  auto reader = kj::heap<AllReader>(*this);
  auto promise = reader->readAllBytes(limit);
  return promise.attach(kj::mv(reader));
}